

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZDICT_analyzeEntropy
                 (void *dstBuffer,size_t maxDstSize,int compressionLevel,void *srcBuffer,
                 size_t *fileSizes,uint nbFiles,void *dictBuffer,size_t dictBufferSize,
                 uint notificationLevel)

{
  byte *pbVar1;
  BYTE *pBVar2;
  seqDef *psVar3;
  undefined8 uVar4;
  ZSTD_customMem customMem;
  ZSTD_customMem customMem_00;
  U32 offset;
  uint uVar5;
  int iVar6;
  long lVar7;
  ZSTD_CDict *cdict;
  ZSTD_CCtx *cctx;
  void *dst;
  seqStore_t *seqStorePtr_00;
  size_t sVar8;
  byte *pbVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  void *bufferSize;
  long lVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  seqStore_t *seqStorePtr;
  offsetCount_t bestRepOffset [4];
  uint offcodeCount [31];
  uint matchLengthCount [53];
  short offcodeNCount [31];
  short litLengthNCount [36];
  uint litLengthCount [36];
  short matchLengthNCount [53];
  uint countLit [256];
  HUF_CElt hufTable [257];
  U32 wksp [1216];
  U32 repOffset [1024];
  undefined8 in_stack_ffffffffffffcd30;
  ZSTD_CCtx *pZVar31;
  undefined4 in_stack_ffffffffffffcd3c;
  undefined4 uVar32;
  undefined8 local_3298;
  undefined8 uStack_3290;
  undefined8 local_3288;
  undefined8 uStack_3280;
  void *local_3270;
  undefined4 local_3250;
  undefined4 local_324c;
  undefined4 local_3248;
  uint local_3238 [29];
  uint auStack_31c4 [59];
  short local_30d8 [32];
  short local_3098 [40];
  uint local_3048 [2];
  undefined8 uStack_3040;
  short local_2fb8 [56];
  uint local_2f48 [2];
  undefined8 uStack_2f40;
  undefined8 auStack_2f38 [124];
  undefined8 local_2b54;
  HUF_CElt local_2b48 [258];
  undefined1 local_2338 [168];
  void *local_2290;
  int local_1038 [1026];
  
  uVar5 = (int)dictBufferSize + 0x20000;
  uVar15 = 0x1f;
  if (uVar5 != 0) {
    for (; uVar5 >> uVar15 == 0; uVar15 = uVar15 - 1) {
    }
  }
  if (nbFiles == 0) {
    uVar20 = 0;
  }
  else {
    uVar17 = 0;
    uVar20 = 0;
    do {
      uVar20 = uVar20 + fileSizes[uVar17];
      uVar17 = uVar17 + 1;
    } while (nbFiles != uVar17);
  }
  uVar19 = (ulong)(nbFiles + (nbFiles == 0));
  uVar17 = uVar20 / uVar19;
  local_3270 = srcBuffer;
  if ((uVar15 ^ 0x1f) == 0) {
    cctx = (ZSTD_CCtx *)0x0;
    dst = (void *)0x0;
    cdict = (ZSTD_CDict *)0x0;
    sVar8 = 0xffffffffffffffde;
  }
  else {
    lVar7 = 0;
    do {
      (local_2f48 + lVar7)[0] = 1;
      (local_2f48 + lVar7)[1] = 1;
      *(undefined8 *)((long)auStack_2f38 + (lVar7 + -2) * 4) = 0x100000001;
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0x100);
    uVar18 = (ulong)(0x20 - (uVar15 ^ 0x1f));
    lVar7 = uVar18 - 1;
    auVar25._8_4_ = (int)lVar7;
    auVar25._0_8_ = lVar7;
    auVar25._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar16 = 0;
    auVar25 = auVar25 ^ _DAT_001e9030;
    auVar29 = _DAT_001e9020;
    auVar27 = _DAT_001e8fc0;
    do {
      auVar30 = auVar27 ^ _DAT_001e9030;
      iVar6 = auVar25._4_4_;
      if ((bool)(~(auVar30._4_4_ == iVar6 && auVar25._0_4_ < auVar30._0_4_ || iVar6 < auVar30._4_4_)
                & 1)) {
        *(undefined4 *)((long)local_3238 + uVar16) = 1;
      }
      if ((auVar30._12_4_ != auVar25._12_4_ || auVar30._8_4_ <= auVar25._8_4_) &&
          auVar30._12_4_ <= auVar25._12_4_) {
        *(undefined4 *)((long)local_3238 + uVar16 + 4) = 1;
      }
      iVar22 = SUB164(auVar29 ^ _DAT_001e9030,4);
      if (iVar22 <= iVar6 && (iVar22 != iVar6 || SUB164(auVar29 ^ _DAT_001e9030,0) <= auVar25._0_4_)
         ) {
        *(undefined4 *)((long)local_3238 + uVar16 + 8) = 1;
        *(undefined4 *)((long)local_3238 + uVar16 + 0xc) = 1;
      }
      lVar7 = auVar27._8_8_;
      auVar27._0_8_ = auVar27._0_8_ + 4;
      auVar27._8_8_ = lVar7 + 4;
      lVar7 = auVar29._8_8_;
      auVar29._0_8_ = auVar29._0_8_ + 4;
      auVar29._8_8_ = lVar7 + 4;
      uVar16 = uVar16 + 0x10;
    } while ((uVar18 * 4 + 0xc & 0xfffffffffffffff0) != uVar16);
    lVar7 = 3;
    auVar30 = _DAT_001e9020;
    auVar26 = _DAT_001e8fc0;
    do {
      if (SUB164(auVar26 ^ _DAT_001e9030,4) == -0x80000000 &&
          SUB164(auVar26 ^ _DAT_001e9030,0) < -0x7fffffcb) {
        auStack_31c4[lVar7] = 1;
        auStack_31c4[lVar7 + 1] = 1;
      }
      if (SUB164(auVar30 ^ _DAT_001e9030,4) == -0x80000000 &&
          SUB164(auVar30 ^ _DAT_001e9030,0) < -0x7fffffcb) {
        auStack_31c4[lVar7 + 2] = 1;
        auStack_31c4[lVar7 + 3] = 1;
      }
      lVar21 = auVar26._8_8_;
      auVar26._0_8_ = auVar26._0_8_ + 4;
      auVar26._8_8_ = lVar21 + 4;
      lVar21 = auVar30._8_8_;
      auVar30._0_8_ = auVar30._0_8_ + 4;
      auVar30._8_8_ = lVar21 + 4;
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0x3b);
    lVar7 = 0;
    do {
      (local_3048 + lVar7)[0] = 1;
      (local_3048 + lVar7)[1] = 1;
      *(undefined8 *)((long)&uStack_3040 + lVar7 * 4) = 0x100000001;
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0x24);
    memset(local_1038,0,0x1000);
    local_1038[8] = 1;
    local_1038[4] = 1;
    local_1038[1] = 1;
    local_3298 = 0;
    uStack_3290 = 0;
    local_3288 = 0;
    uStack_3280 = 0;
    if (compressionLevel == 0) {
      compressionLevel = 3;
    }
    if (uVar20 < uVar19) {
      uVar17 = 0xffffffffffffffff;
    }
    ZSTD_getCParams_internal
              ((ZSTD_compressionParameters *)local_2338,compressionLevel,uVar17,dictBufferSize,
               ZSTD_cpm_unknown);
    local_2338._32_4_ = 0;
    local_2338._28_4_ = ZSTD_fast;
    local_3250 = 1;
    local_324c = 0;
    local_3248 = 0;
    memset((ZSTD_CCtx_params *)local_2338,0,0xd0);
    local_2338._32_4_ = 1;
    local_2338._4_4_ = local_2338._0_4_;
    local_2338._152_16_ = (undefined1  [16])0x0;
    local_2290 = (void *)0x0;
    customMem.opaque = (void *)0x0;
    customMem.customAlloc = (ZSTD_allocFunction)0x0;
    customMem.customFree = (ZSTD_freeFunction)0x0;
    cdict = ZSTD_createCDict_advanced2
                      (dictBuffer,dictBufferSize,ZSTD_dlm_byRef,ZSTD_dct_rawContent,
                       (ZSTD_CCtx_params *)local_2338,customMem);
    customMem_00.customFree._0_4_ = nbFiles;
    customMem_00.customAlloc = (ZSTD_allocFunction)in_stack_ffffffffffffcd30;
    customMem_00.customFree._4_4_ = in_stack_ffffffffffffcd3c;
    customMem_00.opaque = (void *)maxDstSize;
    cctx = ZSTD_createCCtx_advanced(customMem_00);
    dst = malloc(0x20000);
    if (dst == (void *)0x0 || (cctx == (ZSTD_CCtx *)0x0 || cdict == (ZSTD_CDict *)0x0)) {
      sVar8 = 0xffffffffffffffc0;
      if (notificationLevel != 0) {
        ZDICT_analyzeEntropy_cold_1();
      }
    }
    else {
      pZVar31 = cctx;
      if (nbFiles != 0) {
        iVar6 = 1 << ((byte)local_2338._0_4_ & 0x1f);
        if (0x1ffff < iVar6) {
          iVar6 = 0x20000;
        }
        seqStorePtr_00 = &cctx->seqStore;
        uVar32 = 0;
        lVar7 = 0;
        lVar21 = 0;
        do {
          uVar20 = fileSizes[lVar7];
          if ((ulong)(long)iVar6 < fileSizes[lVar7]) {
            uVar20 = (long)iVar6;
          }
          sVar8 = ZSTD_compressBegin_usingCDict_internal
                            (cctx,cdict,(ZSTD_frameParameters)ZEXT812(0),0xffffffffffffffff);
          if (sVar8 < 0xffffffffffffff89) {
            sVar8 = ZSTD_compressBlock_deprecated
                              (cctx,dst,0x20000,(void *)((long)local_3270 + lVar21),uVar20);
            cctx = pZVar31;
            pZVar31 = cctx;
            if (sVar8 < 0xffffffffffffff89) {
              if (sVar8 != 0) {
                pbVar9 = (cctx->seqStore).litStart;
                pbVar1 = (cctx->seqStore).lit;
                if (pbVar9 < pbVar1) {
                  do {
                    local_2f48[*pbVar9] = local_2f48[*pbVar9] + 1;
                    pbVar9 = pbVar9 + 1;
                  } while (pbVar9 != pbVar1);
                }
                uVar20 = (ulong)((long)(cctx->seqStore).sequences -
                                (long)(cctx->seqStore).sequencesStart) >> 3;
                ZSTD_seqToCodes(seqStorePtr_00);
                uVar5 = (uint)uVar20;
                if (uVar5 != 0) {
                  pBVar2 = (cctx->seqStore).ofCode;
                  uVar17 = 0;
                  do {
                    local_3238[pBVar2[uVar17]] = local_3238[pBVar2[uVar17]] + 1;
                    uVar17 = uVar17 + 1;
                  } while ((uVar20 & 0xffffffff) != uVar17);
                }
                if (uVar5 != 0) {
                  pBVar2 = (cctx->seqStore).mlCode;
                  uVar17 = 0;
                  do {
                    auStack_31c4[(ulong)pBVar2[uVar17] + 3] =
                         auStack_31c4[(ulong)pBVar2[uVar17] + 3] + 1;
                    uVar17 = uVar17 + 1;
                  } while ((uVar20 & 0xffffffff) != uVar17);
                }
                if (uVar5 != 0) {
                  pBVar2 = (cctx->seqStore).llCode;
                  uVar17 = 0;
                  do {
                    local_3048[pBVar2[uVar17]] = local_3048[pBVar2[uVar17]] + 1;
                    uVar17 = uVar17 + 1;
                  } while ((uVar20 & 0xffffffff) != uVar17);
                }
                pZVar31 = cctx;
                if (1 < uVar5) {
                  psVar3 = seqStorePtr_00->sequencesStart;
                  uVar14 = psVar3->offBase - 3;
                  uVar5 = psVar3[1].offBase - 3;
                  uVar20 = (ulong)uVar14;
                  if (0x3ff < uVar14) {
                    uVar20 = 0;
                  }
                  if (0x3ff < uVar5) {
                    uVar5 = 0;
                  }
                  local_1038[uVar20] = local_1038[uVar20] + 3;
                  local_1038[uVar5] = local_1038[uVar5] + 1;
                }
              }
            }
            else if (2 < notificationLevel) {
              ZDICT_analyzeEntropy_cold_3();
              pZVar31 = cctx;
            }
          }
          else if (notificationLevel != 0) {
            cctx = pZVar31;
            ZDICT_analyzeEntropy_cold_2();
            pZVar31 = cctx;
          }
          lVar21 = lVar21 + fileSizes[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != CONCAT44(uVar32,nbFiles));
      }
      cctx = pZVar31;
      if (3 < notificationLevel) {
        ZDICT_analyzeEntropy_cold_4();
        cctx = pZVar31;
      }
      uVar5 = 0xb;
      sVar10 = HUF_buildCTable_wksp(local_2b48,local_2f48,0xff,0xb,local_2338,0x1300);
      if (sVar10 < 0xffffffffffffff89) {
        sVar8 = sVar10;
        if (sVar10 == 8) {
          if (1 < notificationLevel) {
            ZDICT_analyzeEntropy_cold_6();
          }
          lVar7 = 0;
          do {
            auVar28._8_4_ = (int)lVar7;
            auVar28._0_8_ = lVar7;
            auVar28._12_4_ = (int)((ulong)lVar7 >> 0x20);
            auVar29 = (auVar28 | _DAT_001e8fc0) ^ _DAT_001e9030;
            if (auVar29._4_4_ == -0x80000000 && auVar29._0_4_ < -0x7fffff01) {
              local_2f48[lVar7 + 1] = 2;
              *(undefined4 *)((long)auStack_2f38 + (lVar7 + -2) * 4) = 2;
            }
            auVar29 = (auVar28 | _DAT_001e9020) ^ _DAT_001e9030;
            if (auVar29._4_4_ == -0x80000000 && auVar29._0_4_ < -0x7fffff01) {
              *(undefined4 *)((long)auStack_2f38 + (lVar7 + -1) * 4) = 2;
              *(undefined4 *)((long)auStack_2f38 + lVar7 * 4) = 2;
            }
            lVar7 = lVar7 + 4;
          } while (lVar7 != 0x100);
          local_2f48[0] = 4;
          local_2b54 = 0x100000001;
          sVar11 = HUF_buildCTable_wksp(local_2b48,local_2f48,0xff,0xb,local_2338,0x1300);
          sVar8 = 9;
          if (sVar11 != 9) {
            __assert_fail("maxNbBits==9",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xc210,
                          "size_t ZDICT_analyzeEntropy(void *, size_t, int, const void *, const size_t *, unsigned int, const void *, size_t, unsigned int)"
                         );
          }
        }
        uVar5 = (uint)sVar8;
        sVar11 = 0;
      }
      else {
        sVar11 = sVar10;
        if (notificationLevel != 0) {
          ZDICT_analyzeEntropy_cold_5();
        }
      }
      sVar8 = sVar11;
      if (sVar10 < 0xffffffffffffff89) {
        lVar7 = 1;
        do {
          uStack_3280 = CONCAT44(local_1038[lVar7],(int)lVar7);
          uVar20 = 3;
          do {
            uVar14 = (int)uVar20 - 1;
            uVar17 = (ulong)uVar14;
            if (*(uint *)((long)&local_3298 + uVar20 * 8 + 4) <=
                *(uint *)((long)&local_3298 + uVar17 * 8 + 4)) break;
            uVar4 = (&local_3298)[uVar17];
            (&local_3298)[uVar17] = (&local_3298)[uVar20];
            (&local_3298)[uVar20] = uVar4;
            uVar20 = uVar17;
          } while (uVar14 != 0);
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x400);
        uVar20 = 0;
        uVar14 = 0;
        do {
          uVar14 = uVar14 + local_3238[uVar20];
          uVar20 = uVar20 + 1;
        } while (uVar18 != uVar20);
        sVar10 = FSE_normalizeCount(local_30d8,8,local_3238,(ulong)uVar14,uVar15,1);
        if (sVar10 < 0xffffffffffffff89) {
          lVar7 = 0;
          uVar15 = 0;
          do {
            uVar15 = uVar15 + auStack_31c4[lVar7 + 3];
            lVar7 = lVar7 + 1;
          } while (lVar7 != 0x35);
          sVar12 = FSE_normalizeCount(local_2fb8,9,auStack_31c4 + 3,(ulong)uVar15,0x34,1);
          if (sVar12 < 0xffffffffffffff89) {
            iVar6 = 0;
            iVar22 = 0;
            iVar23 = 0;
            iVar24 = 0;
            lVar7 = 0;
            do {
              iVar6 = iVar6 + local_3048[lVar7];
              iVar22 = iVar22 + local_3048[lVar7 + 1];
              iVar23 = iVar23 + *(int *)((long)&uStack_3040 + lVar7 * 4);
              iVar24 = iVar24 + *(int *)((long)&uStack_3040 + lVar7 * 4 + 4);
              lVar7 = lVar7 + 4;
            } while (lVar7 != 0x24);
            sVar8 = FSE_normalizeCount(local_3098,9,local_3048,
                                       (ulong)(uint)(iVar24 + iVar22 + iVar23 + iVar6),0x23,1);
            if (sVar8 < 0xffffffffffffff89) {
              uVar15 = (uint)sVar8;
              bufferSize = (void *)maxDstSize;
              sVar13 = HUF_writeCTable_wksp
                                 (dstBuffer,maxDstSize,local_2b48,0xff,uVar5,local_2338,0x1300);
              if (sVar13 < 0xffffffffffffff89) {
                dstBuffer = (void *)((long)dstBuffer + sVar13);
                bufferSize = (void *)(maxDstSize - sVar13);
                sVar8 = sVar11 + sVar13;
              }
              else {
                sVar8 = sVar13;
                if (notificationLevel != 0) {
                  ZDICT_analyzeEntropy_cold_10();
                }
              }
              if (sVar13 < 0xffffffffffffff89) {
                sVar10 = FSE_writeNCount(dstBuffer,(size_t)bufferSize,local_30d8,0x1e,(uint)sVar10);
                if (sVar10 < 0xffffffffffffff89) {
                  dstBuffer = (void *)((long)dstBuffer + sVar10);
                  bufferSize = (void *)((long)bufferSize - sVar10);
                  sVar8 = sVar8 + sVar10;
                }
                else {
                  sVar8 = sVar10;
                  if (notificationLevel != 0) {
                    ZDICT_analyzeEntropy_cold_11();
                  }
                }
                if (sVar10 < 0xffffffffffffff89) {
                  sVar10 = FSE_writeNCount(dstBuffer,(size_t)bufferSize,local_2fb8,0x34,(uint)sVar12
                                          );
                  if (sVar10 < 0xffffffffffffff89) {
                    dstBuffer = (void *)((long)dstBuffer + sVar10);
                    bufferSize = (void *)((long)bufferSize - sVar10);
                    sVar8 = sVar8 + sVar10;
                  }
                  else {
                    sVar8 = sVar10;
                    if (notificationLevel != 0) {
                      ZDICT_analyzeEntropy_cold_12();
                    }
                  }
                  if (sVar10 < 0xffffffffffffff89) {
                    sVar10 = FSE_writeNCount(dstBuffer,(size_t)bufferSize,local_3098,0x23,uVar15);
                    if (sVar10 < 0xffffffffffffff89) {
                      dstBuffer = (void *)((long)dstBuffer + sVar10);
                      bufferSize = (void *)((long)bufferSize - sVar10);
                      sVar8 = sVar8 + sVar10;
                    }
                    else {
                      sVar8 = sVar10;
                      if (notificationLevel != 0) {
                        ZDICT_analyzeEntropy_cold_13();
                      }
                    }
                    if (sVar10 < 0xffffffffffffff89) {
                      if (bufferSize < (void *)0xc) {
                        sVar8 = 0xffffffffffffffba;
                        if (notificationLevel != 0) {
                          ZDICT_analyzeEntropy_cold_14();
                        }
                      }
                      else {
                        *(undefined8 *)dstBuffer = 0x400000001;
                        *(undefined4 *)((long)dstBuffer + 8) = 8;
                        sVar8 = sVar8 + 0xc;
                      }
                    }
                  }
                }
              }
            }
            else if (notificationLevel != 0) {
              ZDICT_analyzeEntropy_cold_9();
            }
          }
          else {
            sVar8 = sVar12;
            if (notificationLevel != 0) {
              ZDICT_analyzeEntropy_cold_8();
            }
          }
        }
        else {
          sVar8 = sVar10;
          if (notificationLevel != 0) {
            ZDICT_analyzeEntropy_cold_7();
          }
        }
      }
    }
  }
  ZSTD_freeCDict(cdict);
  ZSTD_freeCCtx(cctx);
  free(dst);
  return sVar8;
}

Assistant:

static size_t ZDICT_analyzeEntropy(void*  dstBuffer, size_t maxDstSize,
                                   int compressionLevel,
                             const void*  srcBuffer, const size_t* fileSizes, unsigned nbFiles,
                             const void* dictBuffer, size_t  dictBufferSize,
                                   unsigned notificationLevel)
{
    unsigned countLit[256];
    HUF_CREATE_STATIC_CTABLE(hufTable, 255);
    unsigned offcodeCount[OFFCODE_MAX+1];
    short offcodeNCount[OFFCODE_MAX+1];
    U32 offcodeMax = ZSTD_highbit32((U32)(dictBufferSize + 128 KB));
    unsigned matchLengthCount[MaxML+1];
    short matchLengthNCount[MaxML+1];
    unsigned litLengthCount[MaxLL+1];
    short litLengthNCount[MaxLL+1];
    U32 repOffset[MAXREPOFFSET];
    offsetCount_t bestRepOffset[ZSTD_REP_NUM+1];
    EStats_ress_t esr = { NULL, NULL, NULL };
    ZSTD_parameters params;
    U32 u, huffLog = 11, Offlog = OffFSELog, mlLog = MLFSELog, llLog = LLFSELog, total;
    size_t pos = 0, errorCode;
    size_t eSize = 0;
    size_t const totalSrcSize = ZDICT_totalSampleSize(fileSizes, nbFiles);
    size_t const averageSampleSize = totalSrcSize / (nbFiles + !nbFiles);
    BYTE* dstPtr = (BYTE*)dstBuffer;
    U32 wksp[HUF_CTABLE_WORKSPACE_SIZE_U32];

    /* init */
    DEBUGLOG(4, "ZDICT_analyzeEntropy");
    if (offcodeMax>OFFCODE_MAX) { eSize = ERROR(dictionaryCreation_failed); goto _cleanup; }   /* too large dictionary */
    for (u=0; u<256; u++) countLit[u] = 1;   /* any character must be described */
    for (u=0; u<=offcodeMax; u++) offcodeCount[u] = 1;
    for (u=0; u<=MaxML; u++) matchLengthCount[u] = 1;
    for (u=0; u<=MaxLL; u++) litLengthCount[u] = 1;
    memset(repOffset, 0, sizeof(repOffset));
    repOffset[1] = repOffset[4] = repOffset[8] = 1;
    memset(bestRepOffset, 0, sizeof(bestRepOffset));
    if (compressionLevel==0) compressionLevel = ZSTD_CLEVEL_DEFAULT;
    params = ZSTD_getParams(compressionLevel, averageSampleSize, dictBufferSize);

    esr.dict = ZSTD_createCDict_advanced(dictBuffer, dictBufferSize, ZSTD_dlm_byRef, ZSTD_dct_rawContent, params.cParams, ZSTD_defaultCMem);
    esr.zc = ZSTD_createCCtx();
    esr.workPlace = malloc(ZSTD_BLOCKSIZE_MAX);
    if (!esr.dict || !esr.zc || !esr.workPlace) {
        eSize = ERROR(memory_allocation);
        DISPLAYLEVEL(1, "Not enough memory \n");
        goto _cleanup;
    }

    /* collect stats on all samples */
    for (u=0; u<nbFiles; u++) {
        ZDICT_countEStats(esr, &params,
                          countLit, offcodeCount, matchLengthCount, litLengthCount, repOffset,
                         (const char*)srcBuffer + pos, fileSizes[u],
                          notificationLevel);
        pos += fileSizes[u];
    }

    if (notificationLevel >= 4) {
        /* writeStats */
        DISPLAYLEVEL(4, "Offset Code Frequencies : \n");
        for (u=0; u<=offcodeMax; u++) {
            DISPLAYLEVEL(4, "%2u :%7u \n", u, offcodeCount[u]);
    }   }

    /* analyze, build stats, starting with literals */
    {   size_t maxNbBits = HUF_buildCTable_wksp(hufTable, countLit, 255, huffLog, wksp, sizeof(wksp));
        if (HUF_isError(maxNbBits)) {
            eSize = maxNbBits;
            DISPLAYLEVEL(1, " HUF_buildCTable error \n");
            goto _cleanup;
        }
        if (maxNbBits==8) {  /* not compressible : will fail on HUF_writeCTable() */
            DISPLAYLEVEL(2, "warning : pathological dataset : literals are not compressible : samples are noisy or too regular \n");
            ZDICT_flatLit(countLit);  /* replace distribution by a fake "mostly flat but still compressible" distribution, that HUF_writeCTable() can encode */
            maxNbBits = HUF_buildCTable_wksp(hufTable, countLit, 255, huffLog, wksp, sizeof(wksp));
            assert(maxNbBits==9);
        }
        huffLog = (U32)maxNbBits;
    }

    /* looking for most common first offsets */
    {   U32 offset;
        for (offset=1; offset<MAXREPOFFSET; offset++)
            ZDICT_insertSortCount(bestRepOffset, offset, repOffset[offset]);
    }
    /* note : the result of this phase should be used to better appreciate the impact on statistics */

    total=0; for (u=0; u<=offcodeMax; u++) total+=offcodeCount[u];
    errorCode = FSE_normalizeCount(offcodeNCount, Offlog, offcodeCount, total, offcodeMax, /* useLowProbCount */ 1);
    if (FSE_isError(errorCode)) {
        eSize = errorCode;
        DISPLAYLEVEL(1, "FSE_normalizeCount error with offcodeCount \n");
        goto _cleanup;
    }
    Offlog = (U32)errorCode;

    total=0; for (u=0; u<=MaxML; u++) total+=matchLengthCount[u];
    errorCode = FSE_normalizeCount(matchLengthNCount, mlLog, matchLengthCount, total, MaxML, /* useLowProbCount */ 1);
    if (FSE_isError(errorCode)) {
        eSize = errorCode;
        DISPLAYLEVEL(1, "FSE_normalizeCount error with matchLengthCount \n");
        goto _cleanup;
    }
    mlLog = (U32)errorCode;

    total=0; for (u=0; u<=MaxLL; u++) total+=litLengthCount[u];
    errorCode = FSE_normalizeCount(litLengthNCount, llLog, litLengthCount, total, MaxLL, /* useLowProbCount */ 1);
    if (FSE_isError(errorCode)) {
        eSize = errorCode;
        DISPLAYLEVEL(1, "FSE_normalizeCount error with litLengthCount \n");
        goto _cleanup;
    }
    llLog = (U32)errorCode;

    /* write result to buffer */
    {   size_t const hhSize = HUF_writeCTable_wksp(dstPtr, maxDstSize, hufTable, 255, huffLog, wksp, sizeof(wksp));
        if (HUF_isError(hhSize)) {
            eSize = hhSize;
            DISPLAYLEVEL(1, "HUF_writeCTable error \n");
            goto _cleanup;
        }
        dstPtr += hhSize;
        maxDstSize -= hhSize;
        eSize += hhSize;
    }

    {   size_t const ohSize = FSE_writeNCount(dstPtr, maxDstSize, offcodeNCount, OFFCODE_MAX, Offlog);
        if (FSE_isError(ohSize)) {
            eSize = ohSize;
            DISPLAYLEVEL(1, "FSE_writeNCount error with offcodeNCount \n");
            goto _cleanup;
        }
        dstPtr += ohSize;
        maxDstSize -= ohSize;
        eSize += ohSize;
    }

    {   size_t const mhSize = FSE_writeNCount(dstPtr, maxDstSize, matchLengthNCount, MaxML, mlLog);
        if (FSE_isError(mhSize)) {
            eSize = mhSize;
            DISPLAYLEVEL(1, "FSE_writeNCount error with matchLengthNCount \n");
            goto _cleanup;
        }
        dstPtr += mhSize;
        maxDstSize -= mhSize;
        eSize += mhSize;
    }

    {   size_t const lhSize = FSE_writeNCount(dstPtr, maxDstSize, litLengthNCount, MaxLL, llLog);
        if (FSE_isError(lhSize)) {
            eSize = lhSize;
            DISPLAYLEVEL(1, "FSE_writeNCount error with litlengthNCount \n");
            goto _cleanup;
        }
        dstPtr += lhSize;
        maxDstSize -= lhSize;
        eSize += lhSize;
    }

    if (maxDstSize<12) {
        eSize = ERROR(dstSize_tooSmall);
        DISPLAYLEVEL(1, "not enough space to write RepOffsets \n");
        goto _cleanup;
    }
# if 0
    MEM_writeLE32(dstPtr+0, bestRepOffset[0].offset);
    MEM_writeLE32(dstPtr+4, bestRepOffset[1].offset);
    MEM_writeLE32(dstPtr+8, bestRepOffset[2].offset);
#else
    /* at this stage, we don't use the result of "most common first offset",
     * as the impact of statistics is not properly evaluated */
    MEM_writeLE32(dstPtr+0, repStartValue[0]);
    MEM_writeLE32(dstPtr+4, repStartValue[1]);
    MEM_writeLE32(dstPtr+8, repStartValue[2]);
#endif
    eSize += 12;

_cleanup:
    ZSTD_freeCDict(esr.dict);
    ZSTD_freeCCtx(esr.zc);
    free(esr.workPlace);

    return eSize;
}